

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O0

void demo3(void)

{
  IMLE imleObj;
  Param param;
  int D;
  int d;
  int in_stack_0000060c;
  IMLE *in_stack_00000610;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffb28;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffb30;
  Param *in_stack_fffffffffffffb40;
  Index in_stack_fffffffffffffb48;
  IMLE *in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Param *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffc5c;
  Param *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  IMLE *in_stack_fffffffffffffc70;
  IMLE *in_stack_fffffffffffffd00;
  
  IMLE::Param::Param(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
            (in_stack_fffffffffffffb48,(Scalar *)in_stack_fffffffffffffb40);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  IMLE::IMLE(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68,
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  doubleCos1D_train<IMLE>(in_stack_00000610,in_stack_0000060c);
  doubleCos1D_eval<IMLE>(in_stack_fffffffffffffd00);
  IMLE::~IMLE(in_stack_fffffffffffffb70);
  IMLE::Param::~Param(in_stack_fffffffffffffb40);
  return;
}

Assistant:

void demo3()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.3;

    // IMLE object
    IMLE imleObj(d,D,param);

    doubleCos1D_train( imleObj );
    doubleCos1D_eval( imleObj );
}